

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  uint seed;
  
  plan(6);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar2 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",uVar2 & 0xffffffff);
  fprintf(_stdout,"\n");
  srand((uint)uVar2);
  quota_init(&quota,0xffffffff);
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  region_basic();
  region_test_truncate();
  region_test_callbacks();
  region_test_join();
  region_test_alignment();
  region_test_poison();
  slab_cache_destroy(&cache);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(8);
#else
#ifndef NDEBUG
	plan(6);
#else
	plan(5);
#endif
#endif
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	region_basic();
	region_test_truncate();
	region_test_callbacks();
	region_test_join();
	region_test_alignment();
#ifndef ENABLE_ASAN
#ifndef NDEBUG
	region_test_poison();
#endif
#else
	region_test_poison();
	region_test_tiny_reserve_size();
	region_test_truncate_reserved();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}